

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O0

int write_normal_data_chunk(output_file *out,uint len,void *data)

{
  uint uVar1;
  undefined8 in_RDX;
  uint in_ESI;
  long in_RDI;
  uint rnd_up_len;
  int ret;
  undefined4 local_24;
  undefined4 local_4;
  
  uVar1 = *(int *)(in_RDI + 0x24) *
          (((in_ESI + *(int *)(in_RDI + 0x24)) - 1) / *(uint *)(in_RDI + 0x24));
  local_24 = (**(code **)(*(long *)(in_RDI + 0x10) + 0x18))(in_RDI,in_RDX,in_ESI);
  local_4 = local_24;
  if (-1 < local_24) {
    if (in_ESI < uVar1) {
      local_24 = (**(code **)(*(long *)(in_RDI + 0x10) + 8))(in_RDI,uVar1 - in_ESI);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

static int write_normal_data_chunk(struct output_file* out, unsigned int len, void* data) {
  int ret;
  unsigned int rnd_up_len = ALIGN(len, out->block_size);

  ret = out->ops->write(out, data, len);
  if (ret < 0) {
    return ret;
  }

  if (rnd_up_len > len) {
    ret = out->ops->skip(out, rnd_up_len - len);
  }

  return ret;
}